

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::IMUDynamicalSystem::stateDynamics
          (IMUDynamicalSystem *this,Vector *x,Vector *u,TimeIndex param_3)

{
  long lVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  char cVar7;
  char *__function;
  Index extraout_RDX;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  Vector VVar19;
  Vector xk1;
  AngleAxis orientationAA;
  Vector3 orientationV;
  Quaternion orientation;
  DynamicalSystemFunctorBase local_1b8;
  _func_int **pp_Stack_1b0;
  _func_int *local_1a0;
  double local_198;
  double local_190;
  undefined1 local_188 [16];
  double local_178;
  undefined8 uStack_170;
  double local_160;
  double local_158;
  double local_150;
  AngleAxis<double> local_148;
  undefined1 local_128 [16];
  _func_int *local_118;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Quaternion local_b8;
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  cVar7 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[8])(x,u);
  if (cVar7 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  cVar7 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[9])(x,param_3);
  if (cVar7 == '\0') {
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x45,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (((2 < lVar1) && (8 < lVar1)) && (0xe < lVar1)) {
    pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_128 = *(undefined1 (*) [16])(pdVar2 + 3);
    local_118 = (_func_int *)pdVar2[5];
    if (0x11 < lVar1) {
      local_c8 = pdVar2[9];
      dStack_c0 = pdVar2[10];
      local_190 = pdVar2[0xb];
      local_d8 = pdVar2[0xf];
      dStack_d0 = pdVar2[0x10];
      local_198 = pdVar2[0x11];
      local_160 = pdVar2[2];
      local_158 = pdVar2[0xe];
      local_150 = pdVar2[8];
      local_78 = *pdVar2;
      dStack_70 = pdVar2[1];
      local_68 = pdVar2[0xc];
      dStack_60 = pdVar2[0xd];
      local_58 = pdVar2[6];
      dStack_50 = pdVar2[7];
      if (*(char *)&x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_data == '\x01') {
        if (lVar1 < 0x15) goto LAB_00146594;
        local_108._8_4_ = SUB84(pdVar2[0x13] * 0.9999,0);
        local_108._0_8_ = pdVar2[0x12] * 0.9999;
        local_108._12_4_ = (int)((ulong)(pdVar2[0x13] * 0.9999) >> 0x20);
        local_1a0 = (_func_int *)(pdVar2[0x14] * 0.9999);
      }
      else {
        local_1a0 = (_func_int *)0x7ff8000000000000;
        local_108._8_8_ = 0x7ff8000000000000;
        local_108._0_8_ = 0x7ff8000000000000;
      }
      computeQuaternion_(&local_b8,(IMUDynamicalSystem *)x,(Vector3 *)local_128);
      local_f8 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
      local_88 = local_f8 * 0.5 * local_f8;
      local_188._0_8_ = local_d8 * local_88 + local_c8 * local_f8;
      local_188._8_8_ = dStack_d0 * local_88 + dStack_c0 * local_f8;
      uStack_170 = 0;
      local_178 = local_198 * local_88 + local_190 * local_f8;
      dVar8 = local_178 * local_178 +
              (double)local_188._8_8_ * (double)local_188._8_8_ +
              (double)local_188._0_8_ * (double)local_188._0_8_;
      uStack_e0 = 0;
      uStack_80 = 0;
      local_98._8_4_ = SUB84(local_88,0);
      local_98._0_8_ = local_88;
      local_98._12_4_ = (int)((ulong)local_88 >> 0x20);
      dVar5 = 0.0;
      uVar15 = 0;
      uVar16 = 0;
      dStack_f0 = local_f8;
      local_e8 = local_f8;
      if (dVar8 <= 9.999999999999999e-33) {
        local_178 = 1.0;
        uStack_170 = 0;
        local_188 = ZEXT816(0);
      }
      else {
        if (dVar8 < 0.0) {
          uStack_170 = 0;
          dVar8 = sqrt(dVar8);
          uVar15 = (undefined4)extraout_XMM0_Qb;
          uVar16 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        }
        else {
          uVar15 = 0;
          uVar16 = 0;
          dVar8 = SQRT(dVar8);
        }
        auVar12._8_8_ = dVar8;
        auVar12._0_8_ = dVar8;
        local_188 = divpd(local_188,auVar12);
        local_178 = local_178 / dVar8;
        dVar5 = dVar8 * 0.5;
      }
      local_48._8_4_ = uVar15;
      local_48._0_8_ = dVar5;
      local_48._12_4_ = uVar16;
      local_38 = cos(dVar5);
      dVar9 = sin((double)local_48._0_8_);
      dVar18 = local_178 * dVar9;
      dVar10 = dVar9 * (double)local_188._0_8_;
      dVar9 = dVar9 * (double)local_188._8_8_;
      dVar11 = dVar9 * local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0];
      dVar14 = dVar9 * local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[1];
      dVar8 = dVar10 * local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0];
      dVar5 = dVar10 * local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[1];
      dVar6 = local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0] * dVar18 -
              local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2] * dVar10;
      auVar17._8_4_ = SUB84(dVar6,0);
      auVar17._0_8_ =
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * dVar18 -
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar10;
      auVar17._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] =
           SUB168(auVar17 ^ _DAT_00199020,0) +
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2] * dVar9 +
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[0] * local_38;
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] =
           SUB168(auVar17 ^ _DAT_00199020,8) +
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar9 +
           local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * local_38;
      dVar8 = dVar8 + dVar18 * local_b8.m_coeffs.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[2];
      auVar13._8_4_ = SUB84(dVar8,0);
      auVar13._0_8_ =
           dVar5 + dVar18 * local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[3];
      auVar13._12_4_ = (int)((ulong)dVar8 >> 0x20);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] =
           SUB168(auVar13 ^ _DAT_00199030,0) +
           (local_38 *
            local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[2] - dVar11);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] =
           SUB168(auVar13 ^ _DAT_00199030,8) +
           (local_38 *
            local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[3] - dVar14);
      local_148.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
      .array[0] = (double)(*(code *)(x->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data[5])(x);
      local_148.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
      .array[2] = 0.0;
      if ((long)local_148.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0] < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1b8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_148);
      if (2 < (long)pp_Stack_1b0) {
        *local_1b8._vptr_DynamicalSystemFunctorBase =
             (_func_int *)(local_78 + (double)local_98._0_8_ * local_68 + local_58 * local_f8);
        local_1b8._vptr_DynamicalSystemFunctorBase[1] =
             (_func_int *)(dStack_70 + (double)local_98._8_8_ * dStack_60 + dStack_50 * dStack_f0);
        local_1b8._vptr_DynamicalSystemFunctorBase[2] =
             (_func_int *)(local_160 + local_88 * local_158 + local_150 * local_e8);
        if (8 < (long)pp_Stack_1b0) {
          dVar8 = dStack_50 + dStack_60 * dStack_f0;
          auVar3._8_4_ = SUB84(dVar8,0);
          auVar3._0_8_ = local_58 + local_68 * local_f8;
          auVar3._12_4_ = (int)((ulong)dVar8 >> 0x20);
          *(undefined1 (*) [16])(local_1b8._vptr_DynamicalSystemFunctorBase + 6) = auVar3;
          local_1b8._vptr_DynamicalSystemFunctorBase[8] =
               (_func_int *)(local_150 + local_158 * local_e8);
          Eigen::AngleAxis<double>::operator=
                    (&local_148,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_b8);
          uVar15 = SUB84(local_148.m_angle *
                         local_148.m_axis.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[1],0);
          uVar16 = (undefined4)
                   ((ulong)(local_148.m_angle *
                           local_148.m_axis.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1]) >> 0x20);
          local_118 = (_func_int *)
                      (local_148.m_angle *
                      local_148.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2]);
          local_128._8_4_ = uVar15;
          local_128._0_8_ =
               local_148.m_angle *
               local_148.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
          local_128._12_4_ = uVar16;
          if (5 < (long)pp_Stack_1b0) {
            auVar4._8_4_ = uVar15;
            auVar4._0_8_ = local_148.m_angle *
                           local_148.m_axis.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0];
            auVar4._12_4_ = uVar16;
            *(undefined1 (*) [16])(local_1b8._vptr_DynamicalSystemFunctorBase + 3) = auVar4;
            local_1b8._vptr_DynamicalSystemFunctorBase[5] = local_118;
            if (0xb < (long)pp_Stack_1b0) {
              local_1b8._vptr_DynamicalSystemFunctorBase[9] =
                   (_func_int *)(local_c8 + local_d8 * local_f8);
              local_1b8._vptr_DynamicalSystemFunctorBase[10] =
                   (_func_int *)(dStack_c0 + dStack_d0 * dStack_f0);
              local_1b8._vptr_DynamicalSystemFunctorBase[0xb] =
                   (_func_int *)(local_190 + local_198 * local_e8);
              lVar1 = *(long *)(param_3 + 8);
              if (lVar1 < 3) goto LAB_00146594;
              if (0xe < (long)pp_Stack_1b0) {
                pdVar2 = *(double **)param_3;
                dVar9 = pdVar2[lVar1 + -3];
                dVar10 = (pdVar2 + lVar1 + -3)[1];
                dVar8 = pdVar2[lVar1 + -1];
                dVar11 = pdVar2[1];
                dVar5 = (double)x[0x12].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows;
                dVar6 = pdVar2[2];
                local_1b8._vptr_DynamicalSystemFunctorBase[0xc] =
                     (_func_int *)
                     ((double)local_1b8._vptr_DynamicalSystemFunctorBase[0xc] + dVar5 * *pdVar2);
                local_1b8._vptr_DynamicalSystemFunctorBase[0xd] =
                     (_func_int *)
                     ((double)local_1b8._vptr_DynamicalSystemFunctorBase[0xd] + dVar5 * dVar11);
                local_1b8._vptr_DynamicalSystemFunctorBase[0xe] =
                     (_func_int *)
                     (dVar5 * dVar6 + (double)local_1b8._vptr_DynamicalSystemFunctorBase[0xe]);
                if (0x11 < (long)pp_Stack_1b0) {
                  dVar5 = (double)x[0x12].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows;
                  local_1b8._vptr_DynamicalSystemFunctorBase[0xf] =
                       (_func_int *)
                       ((double)local_1b8._vptr_DynamicalSystemFunctorBase[0xf] + dVar9 * dVar5);
                  local_1b8._vptr_DynamicalSystemFunctorBase[0x10] =
                       (_func_int *)
                       ((double)local_1b8._vptr_DynamicalSystemFunctorBase[0x10] + dVar10 * dVar5);
                  local_1b8._vptr_DynamicalSystemFunctorBase[0x11] =
                       (_func_int *)
                       (dVar8 * dVar5 + (double)local_1b8._vptr_DynamicalSystemFunctorBase[0x11]);
                  if (*(char *)&x[0x17].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data != '\x01') {
LAB_00146538:
                    pdVar2 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data;
                    if (pdVar2 == (double *)0x0) {
                      (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                           local_1b8._vptr_DynamicalSystemFunctorBase;
                      (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                           pp_Stack_1b0;
                      local_1b8._vptr_DynamicalSystemFunctorBase = (_func_int **)0x0;
                      pp_Stack_1b0 = (_func_int **)0x0;
                    }
                    else {
                      (**(code **)((long)*pdVar2 + 0x10))(this,pdVar2,&local_1b8);
                    }
                    free(local_1b8._vptr_DynamicalSystemFunctorBase);
                    VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows = extraout_RDX;
                    VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data = (double *)this;
                    return (Vector)VVar19.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage;
                  }
                  if (0x14 < (long)pp_Stack_1b0) {
                    local_1b8._vptr_DynamicalSystemFunctorBase[0x12] = (_func_int *)local_108._0_8_;
                    local_1b8._vptr_DynamicalSystemFunctorBase[0x13] = (_func_int *)local_108._8_8_;
                    local_1b8._vptr_DynamicalSystemFunctorBase[0x14] = local_1a0;
                    goto LAB_00146538;
                  }
                }
              }
            }
          }
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_001465a9;
    }
  }
LAB_00146594:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001465a9:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUDynamicalSystem::stateDynamics(const Vector & x, const Vector & u, TimeIndex)
{
  assertStateVector_(x);
  assertInputVector_(u);

  Vector3 position = x.segment<3>(indexes::pos);
  Vector3 velocity = x.segment<3>(indexes::linVel);
  Vector3 acceleration = x.segment<3>(indexes::linAcc);

  Vector3 orientationV = x.segment<3>(indexes::ori);
  Vector3 angularVelocity = x.segment<3>(indexes::angVel);
  Vector3 angularAcceleration = x.segment<3>(indexes::angAcc);

  Vector3 gyroBias;
  if(withGyroBias_)
  {
    gyroBias = x.segment<3>(indexes::gyroBias);
  }

  Quaternion orientation = computeQuaternion_(orientationV);

  kine::integrateKinematics(position, velocity, acceleration, orientation, angularVelocity, angularAcceleration, dt_);

  // x_{k+1}
  Vector xk1 = Vector::Zero(getStateSize(), 1);

  xk1.segment<3>(indexes::pos) = position;
  xk1.segment<3>(indexes::linVel) = velocity;

  AngleAxis orientationAA(orientation);

  orientationV = orientationAA.angle() * orientationAA.axis();

  xk1.segment<3>(indexes::ori) = orientationV;
  xk1.segment<3>(indexes::angVel) = angularVelocity;

  // inputs
  Vector3 linearJerkInput = u.head<3>();
  Vector3 angularJerkInput = u.tail<3>();

  xk1.segment<3>(indexes::linAcc) += linearJerkInput * dt_;
  xk1.segment<3>(indexes::angAcc) += angularJerkInput * dt_;

  if(withGyroBias_)
  {
    xk1.segment<3>(indexes::gyroBias) = gyroBias * one_;
  }

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}